

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcProject::~IfcProject(IfcProject *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  pointer pLVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  
  pvVar2 = *vtt;
  *(void **)&this->super_IfcObject = pvVar2;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0x12];
  *(void **)&(this->super_IfcObject).field_0x88 = vtt[0x13];
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcObject).field_0xd0 = vtt[0x15];
  pLVar3 = (this->RepresentationContexts).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar3 != (pointer)0x0) {
    operator_delete(pLVar3,(long)(this->RepresentationContexts).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar3);
  }
  pcVar4 = (this->Phase).ptr._M_dataplus._M_p;
  paVar1 = &(this->Phase).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  puVar5 = *(undefined1 **)&(this->super_IfcObject).field_0xe0;
  if (puVar5 != &this->field_0xf0) {
    operator_delete(puVar5,*(long *)&this->field_0xf0 + 1);
  }
  pvVar2 = vtt[1];
  *(void **)&this->super_IfcObject = pvVar2;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0xd];
  *(void **)&(this->super_IfcObject).field_0x88 = vtt[0xe];
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0xf];
  puVar6 = *(undefined1 **)
            &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
             field_0x10;
  puVar5 = &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
            field_0x20;
  if (puVar6 != puVar5) {
    operator_delete(puVar6,*(long *)puVar5 + 1);
  }
  pvVar2 = vtt[3];
  *(void **)&this->super_IfcObject = pvVar2;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[6];
  puVar6 = *(undefined1 **)&(this->super_IfcObject).field_0x60;
  puVar5 = &(this->super_IfcObject).field_0x70;
  if (puVar6 != puVar5) {
    operator_delete(puVar6,*(long *)puVar5 + 1);
  }
  puVar6 = *(undefined1 **)&(this->super_IfcObject).field_0x38;
  puVar5 = &(this->super_IfcObject).field_0x48;
  if (puVar6 != puVar5) {
    operator_delete(puVar6,*(long *)puVar5 + 1);
  }
  puVar5 = *(undefined1 **)&(this->super_IfcObject).field_0x10;
  puVar6 = &(this->super_IfcObject).field_0x20;
  if (puVar5 != puVar6) {
    operator_delete(puVar5,*(long *)puVar6 + 1);
    return;
  }
  return;
}

Assistant:

IfcProject() : Object("IfcProject") {}